

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"tab[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar2);
    poVar1 = std::operator<<(poVar1,"]: ");
    poVar1 = std::operator<<(poVar1,"Napis"[lVar2]);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return 0;
}

Assistant:

int main() {
    
    char tab[]="Napis";

    int i = 0;
    while(tab[i] != '\0') {
        cout << "tab[" << i << "]: " << tab[i] << endl;
        i++;
    }

    return 0;
}